

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solitaire.cpp
# Opt level: O3

void __thiscall
solitaire::Solitaire::tryAddPulledOutCardToHand
          (Solitaire *this,optional<solitaire::cards::Card> *card,SnapshotPtr *snapshot)

{
  pointer *ppCVar1;
  MoveCardsOperationSnapshotCreator *pMVar2;
  Snapshot *pSVar3;
  iterator __position;
  pointer *__ptr;
  
  if ((card->super__Optional_base<solitaire::cards::Card,_true,_true>)._M_payload.
      super__Optional_payload_base<solitaire::cards::Card>._M_engaged == true) {
    pMVar2 = (this->moveCardsOperationSnapshotCreator)._M_t.
             super___uniq_ptr_impl<solitaire::archivers::interfaces::MoveCardsOperationSnapshotCreator,_std::default_delete<solitaire::archivers::interfaces::MoveCardsOperationSnapshotCreator>_>
             ._M_t.
             super__Tuple_impl<0UL,_solitaire::archivers::interfaces::MoveCardsOperationSnapshotCreator_*,_std::default_delete<solitaire::archivers::interfaces::MoveCardsOperationSnapshotCreator>_>
             .
             super__Head_base<0UL,_solitaire::archivers::interfaces::MoveCardsOperationSnapshotCreator_*,_false>
             ._M_head_impl;
    pSVar3 = (snapshot->_M_t).
             super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
             ._M_t.
             super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
             .super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>.
             _M_head_impl;
    (snapshot->_M_t).
    super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    ._M_t.
    super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    .super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>._M_head_impl =
         (Snapshot *)0x0;
    (*pMVar2->_vptr_MoveCardsOperationSnapshotCreator[3])();
    if (pSVar3 != (Snapshot *)0x0) {
      (*pSVar3->_vptr_Snapshot[1])();
    }
    if ((card->super__Optional_base<solitaire::cards::Card,_true,_true>)._M_payload.
        super__Optional_payload_base<solitaire::cards::Card>._M_engaged == false) {
      std::__throw_bad_optional_access();
    }
    __position._M_current =
         (this->cardsInHand).
         super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->cardsInHand).
        super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>::
      _M_realloc_insert<solitaire::cards::Card_const&>
                ((vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>> *)
                 &this->cardsInHand,__position,(Card *)card);
    }
    else {
      *__position._M_current =
           (Card)(card->super__Optional_base<solitaire::cards::Card,_true,_true>)._M_payload.
                 super__Optional_payload_base<solitaire::cards::Card>._M_payload;
      ppCVar1 = &(this->cardsInHand).
                 super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppCVar1 = *ppCVar1 + 1;
    }
  }
  return;
}

Assistant:

void Solitaire::tryAddPulledOutCardToHand(
    const std::optional<Card>& card, SnapshotPtr snapshot)
{
    if (card) {
        moveCardsOperationSnapshotCreator->saveSourcePileSnapshot(std::move(snapshot));
        cardsInHand.push_back(card.value());
    }
}